

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O3

void __thiscall nivalis::Plotter::handle_mouse_move(Plotter *this,int px,int py)

{
  pointer pPVar1;
  int iVar2;
  pointer pPVar3;
  pointer puVar4;
  double dVar5;
  double dVar6;
  ulong uVar7;
  uint64_t uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar17 [16];
  
  uVar7 = (ulong)this->drag_marker;
  if ((uVar7 == 0xffffffffffffffff) ||
     (pPVar3 = (this->pt_markers).
               super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>.
               _M_impl.super__Vector_impl_data._M_start,
     uVar10 = ((long)(this->pt_markers).
                     super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
              0x6db6db6db6db6db7, uVar10 < uVar7 || uVar10 - uVar7 == 0)) {
LAB_0012b0d8:
    if (this->drag_view != true) {
      if (-1 < (py | px)) {
        uVar7 = (ulong)((this->view).swid * py + px);
        puVar4 = (this->grid).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((uVar7 < (ulong)((long)(this->grid).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3))
           && (puVar4[uVar7] != 0xffffffffffffffff)) {
          detect_marker_click(this,px,py,(bool)(this->drag_trace ^ 1),false);
          return;
        }
      }
      (this->marker_text)._M_string_length = 0;
      *(this->marker_text)._M_dataplus._M_p = '\0';
      return;
    }
    iVar11 = this->dragx;
    iVar2 = this->dragy;
    this->dragx = px;
    this->dragy = py;
    dVar15 = (this->view).xmax;
    dVar13 = (this->view).xmin;
    dVar5 = (this->view).ymax;
    dVar6 = (this->view).ymin;
    dVar22 = ((dVar15 - dVar13) / (double)(this->view).swid) * (double)(px - iVar11);
    (this->view).xmax = dVar15 - dVar22;
    (this->view).xmin = dVar13 - dVar22;
    dVar15 = ((dVar5 - dVar6) / (double)(this->view).shigh) * (double)(py - iVar2);
    (this->view).ymax = dVar15 + dVar5;
    (this->view).ymin = dVar15 + dVar6;
    goto LAB_0012b216;
  }
  pPVar1 = pPVar3 + uVar7;
  if (pPVar3[uVar7].drag_var_x == 0xffffffffffffffff) {
    uVar8 = pPVar1->drag_var_y;
    if (uVar8 == 0xffffffffffffffff) goto LAB_0012b0d8;
LAB_0012b012:
    iVar11 = (this->view).shigh;
    dVar15 = (this->view).ymin;
    dVar13 = (double)iVar11;
    (this->env).vars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar8] =
         (((this->view).ymax - dVar15) * (double)(iVar11 - py)) / dVar13 + dVar15;
  }
  else {
    dVar15 = (this->view).xmin;
    (this->env).vars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[pPVar3[uVar7].drag_var_x] =
         (((this->view).xmax - dVar15) * (double)px) / (double)(this->view).swid + dVar15;
    uVar8 = pPVar1->drag_var_y;
    if (uVar8 != 0xffffffffffffffff) goto LAB_0012b012;
    iVar11 = (this->view).shigh;
    dVar13 = (double)iVar11;
  }
  iVar2 = (this->view).swid;
  dVar5 = (this->view).ymax;
  dVar15 = (this->view).xmin;
  auVar20._0_8_ = (dVar5 - pPVar1->y) * dVar13;
  auVar20._8_8_ = (pPVar1->x - dVar15) * (double)iVar2;
  auVar14._0_8_ = dVar5 - (this->view).ymin;
  auVar14._8_8_ = (this->view).xmax - dVar15;
  auVar21 = divpd(auVar20,auVar14);
  auVar16._0_4_ = (float)auVar21._0_8_;
  auVar16._4_4_ = (float)auVar21._8_8_;
  auVar16._8_8_ = 0;
  auVar14 = maxps(ZEXT816(0),auVar16);
  auVar21._0_4_ = (float)iVar11 + -1.0;
  auVar21._4_4_ = (float)iVar2 + -1.0;
  auVar21._8_8_ = 0;
  iVar11 = -(uint)(auVar21._0_4_ < auVar14._0_4_);
  iVar12 = -(uint)(auVar21._4_4_ < auVar14._4_4_);
  auVar18._4_4_ = iVar12;
  auVar18._0_4_ = iVar11;
  auVar18._8_4_ = iVar12;
  auVar18._12_4_ = iVar12;
  auVar17._8_8_ = auVar18._8_8_;
  auVar17._4_4_ = iVar11;
  auVar17._0_4_ = iVar11;
  uVar9 = movmskpd((int)pPVar1,auVar17);
  fVar19 = auVar21._4_4_;
  if ((uVar9 & 2) == 0) {
    fVar19 = auVar14._4_4_;
  }
  if ((uVar9 & 1) == 0) {
    auVar21 = auVar14;
  }
  iVar11 = (int)(auVar21._0_4_ + 0.5);
  if ((this->grid).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[iVar2 * iVar11 + (int)(fVar19 + 0.5)] != 0xffffffffffffffff)
  {
    detect_marker_click(this,(int)(fVar19 + 0.5),iVar11,true,false);
  }
LAB_0012b216:
  this->require_update = true;
  return;
}

Assistant:

void Plotter::handle_mouse_move(int px, int py) {
    if (~drag_marker &&
        drag_marker < pt_markers.size() &&
            (~pt_markers[drag_marker].drag_var_x ||
             ~pt_markers[drag_marker].drag_var_y)) {
        // Draggable marker
        auto& ptm = pt_markers[drag_marker];
        if (~ptm.drag_var_x) {
            env.vars[ptm.drag_var_x] = _SX_TO_X(px);
        }
        if (~ptm.drag_var_y) {
            env.vars[ptm.drag_var_y] = _SY_TO_Y(py);
        }
        int sx = (int)(std::min(std::max(_X_TO_SX(ptm.x), 0.f), (float) view.swid - 1.f) + 0.5f);
        int sy = (int)(std::min(std::max(_Y_TO_SY(ptm.y), 0.f), (float) view.shigh - 1.f) + 0.5f);
        if (~grid[sy * view.swid + sx]) detect_marker_click(sx, sy, true, false);
        require_update = true;
        return;
    }
    if (drag_view) {
        // Dragging background
        int dx = px - dragx;
        int dy = py - dragy;
        dragx = px; dragy = py;
        double fx = (view.xmax - view.xmin) / view.swid * dx;
        double fy = (view.ymax - view.ymin) / view.shigh * dy;
        view.xmax -= fx; view.xmin -= fx;
        view.ymax += fy; view.ymin += fy;
        require_update = true;
    } else if (px >= 0 && py >= 0 &&
            py * view.swid + px < grid.size() &&
            ~grid[py * view.swid + px]) {
        // Trace drag mode
        // Show marker if point marker under cursor
        detect_marker_click(px, py, !drag_trace, false);
    } else {
        marker_text.clear();
    }
}